

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O2

void __thiscall
amrex::MFNodeBilinear::interp
          (MFNodeBilinear *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *param_7,Geometry *param_8,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  Box lhs;
  Box result;
  MFIter mfi;
  double *local_250;
  double *local_248;
  double *local_240;
  Box local_208;
  long local_1e8;
  FabArray<amrex::FArrayBox> *local_1e0;
  FabArray<amrex::FArrayBox> *local_1d8;
  long local_1d0;
  long local_1c8;
  ulong local_1c0;
  long local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  long local_1a0;
  long local_198;
  double local_190;
  double local_188;
  double local_180;
  ulong local_178;
  long local_170;
  ulong local_168;
  long local_160;
  Box local_158;
  Array4<const_double> local_130;
  Array4<double> local_f0;
  Box local_ac;
  MFIter local_90;
  
  local_1e0 = &crsemf->super_FabArray<amrex::FArrayBox>;
  local_1d8 = &finemf->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)finemf,'\0');
  if (nc < 1) {
    nc = 0;
  }
  local_1b0 = (ulong)(uint)nc;
  local_1d0 = (long)ccomp;
  local_1e8 = (long)fcomp << 3;
  while (local_90.currentIndex < local_90.endIndex) {
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_f0,local_1d8,&local_90);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_130,local_1e0,&local_90);
    MFIter::validbox(&local_ac,&local_90);
    local_158.bigend.vect[1] = local_ac.bigend.vect[1];
    local_158.bigend.vect[2] = local_ac.bigend.vect[2];
    local_158.btype.itype = local_ac.btype.itype;
    local_158.smallend.vect[0] = local_ac.smallend.vect[0];
    local_158.smallend.vect[1] = local_ac.smallend.vect[1];
    local_158.smallend.vect[2] = local_ac.smallend.vect[2];
    local_158.bigend.vect[0] = local_ac.bigend.vect[0];
    Box::grow(&local_158,ng);
    local_208.smallend.vect[0] = local_158.smallend.vect[0];
    local_208.smallend.vect[1] = local_158.smallend.vect[1];
    local_208.smallend.vect[2] = local_158.smallend.vect[2];
    local_208.bigend.vect[0] = local_158.bigend.vect[0];
    local_208.bigend.vect[1] = local_158.bigend.vect[1];
    local_208.bigend.vect[2] = local_158.bigend.vect[2];
    local_208.btype.itype = local_158.btype.itype;
    Box::operator&=(&local_208,dest_domain);
    iVar1 = ratio->vect[0];
    iVar2 = ratio->vect[1];
    iVar3 = ratio->vect[2];
    local_1a8 = (ulong)local_208.smallend.vect[1];
    local_1c0 = (ulong)local_208.smallend.vect[2];
    local_180 = 1.0 / (double)iVar1;
    local_188 = 1.0 / (double)iVar2;
    local_190 = 1.0 / (double)iVar3;
    local_170 = local_f0.jstride * 8;
    local_1a0 = local_f0.kstride * 8;
    local_250 = (double *)
                (local_1e8 * local_f0.nstride +
                 (local_1c0 - (long)local_f0.begin.z) * local_1a0 +
                 (local_1a8 - (long)local_f0.begin.y) * local_170 +
                 (long)local_208.smallend.vect[0] * 8 + (long)local_f0.begin.x * -8 +
                (long)local_f0.p);
    local_1b8 = local_f0.nstride * 8;
    local_1c8 = local_130.nstride;
    local_178 = (ulong)(uint)local_208.bigend.vect[0];
    local_160 = (long)local_208.bigend.vect[1];
    local_198 = (long)local_208.bigend.vect[2];
    uVar18 = 0;
    while (uVar8 = uVar18, uVar8 != local_1b0) {
      lVar5 = (local_1d0 + uVar8) * local_130.nstride;
      local_248 = local_250;
      for (uVar18 = local_1c0; (long)uVar18 <= local_198; uVar18 = uVar18 + 1) {
        uVar17 = (uint)uVar18;
        local_240 = local_248;
        for (uVar25 = local_1a8; (long)uVar25 <= local_160; uVar25 = uVar25 + 1) {
          if (local_208.smallend.vect[0] <= local_208.bigend.vect[0]) {
            uVar24 = (uint)uVar25;
            pdVar6 = local_240;
            uVar20 = (long)local_208.smallend.vect[0];
            iVar14 = -local_208.smallend.vect[0];
            do {
              uVar19 = (uint)uVar20;
              if (iVar1 == 4) {
                if ((long)uVar20 < 0) {
                  uVar21 = (int)uVar19 >> 2;
                }
                else {
                  uVar21 = uVar19 >> 2;
                }
              }
              else if (iVar1 == 2) {
                if ((long)uVar20 < 0) {
                  uVar21 = (int)uVar19 >> 1;
                }
                else {
                  uVar21 = uVar19 >> 1;
                }
              }
              else {
                uVar21 = uVar19;
                if (iVar1 != 1) {
                  if ((long)uVar20 < 0) {
                    uVar21 = ~((iVar14 + -1) / iVar1);
                  }
                  else {
                    uVar21 = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 |
                                          uVar20 & 0xffffffff) / (long)iVar1);
                  }
                }
              }
              uVar27 = uVar24;
              if (((iVar2 != 1) && (uVar27 = (int)uVar24 >> 2, iVar2 != 4)) &&
                 (uVar27 = (int)uVar24 >> 1, iVar2 != 2)) {
                if ((long)uVar25 < 0) {
                  uVar27 = ~((int)~uVar24 / iVar2);
                }
                else {
                  uVar27 = (uint)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 |
                                        uVar25 & 0xffffffff) / (long)iVar2);
                }
              }
              uVar4 = uVar17;
              if (((iVar3 != 1) && (uVar4 = (int)uVar17 >> 2, iVar3 != 4)) &&
                 (uVar4 = (int)uVar17 >> 1, iVar3 != 2)) {
                if ((long)uVar18 < 0) {
                  uVar4 = ~((int)~uVar17 / iVar3);
                }
                else {
                  uVar4 = (uint)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 |
                                       uVar18 & 0xffffffff) / (long)iVar3);
                }
              }
              uVar15 = uVar21 * iVar1;
              uVar23 = uVar27 * iVar2;
              uVar12 = uVar4 * iVar3;
              iVar11 = uVar17 - uVar12;
              dVar28 = (double)(int)(-iVar1 * uVar21 + uVar19);
              iVar26 = uVar24 - uVar23;
              dVar29 = (double)iVar26;
              dVar30 = (double)iVar11;
              if ((iVar26 == 0 || uVar19 == uVar15) || (uVar17 == uVar12)) {
                if ((uVar24 == uVar23) || (uVar17 == uVar12)) {
                  if ((uVar19 == uVar15) || (uVar17 == uVar12)) {
                    if (iVar26 == 0 || uVar19 == uVar15) {
                      if (uVar19 == uVar15) {
                        if (uVar24 == uVar23) {
                          if (uVar17 == uVar12) {
                            dVar28 = local_130.p
                                     [(int)(uVar27 - local_130.begin.y) * local_130.jstride +
                                      (long)(int)(uVar21 - local_130.begin.x) +
                                      (int)(uVar4 - local_130.begin.z) * local_130.kstride + lVar5];
                          }
                          else {
                            lVar7 = (int)(uVar27 - local_130.begin.y) * local_130.jstride;
                            dVar28 = ((double)(iVar3 - iVar11) *
                                      local_130.p
                                      [lVar7 + (long)(int)(uVar21 - local_130.begin.x) +
                                               local_130.kstride * (int)(uVar4 - local_130.begin.z)
                                               + lVar5] +
                                     dVar30 * local_130.p
                                              [lVar7 + (long)(int)(uVar21 - local_130.begin.x) +
                                                       (int)((uVar4 - local_130.begin.z) + 1) *
                                                       local_130.kstride + lVar5]) * local_190;
                          }
                        }
                        else {
                          lVar7 = (int)(uVar4 - local_130.begin.z) * local_130.kstride;
                          dVar28 = ((double)(iVar2 - iVar26) *
                                    local_130.p
                                    [local_130.jstride * (int)(uVar27 - local_130.begin.y) +
                                     (long)(int)(uVar21 - local_130.begin.x) + lVar7 + lVar5] +
                                   dVar29 * local_130.p
                                            [(int)((uVar27 - local_130.begin.y) + 1) *
                                             local_130.jstride +
                                             (long)(int)(uVar21 - local_130.begin.x) + lVar7 + lVar5
                                            ]) * local_188;
                        }
                      }
                      else {
                        lVar9 = (int)(uVar27 - local_130.begin.y) * local_130.jstride;
                        lVar7 = (int)(uVar4 - local_130.begin.z) * local_130.kstride;
                        dVar28 = ((double)(int)((uVar21 + 1) * iVar1 + iVar14) *
                                  local_130.p
                                  [lVar9 + (long)(int)(uVar21 - local_130.begin.x) + lVar7 + lVar5]
                                 + dVar28 * local_130.p
                                            [lVar9 + (long)(int)((uVar21 - local_130.begin.x) + 1) +
                                                     lVar7 + lVar5]) * local_180;
                      }
                    }
                    else {
                      iVar11 = uVar21 - local_130.begin.x;
                      dVar30 = (double)(int)((uVar21 + 1) * iVar1 + iVar14);
                      lVar10 = local_130.jstride * (int)(uVar27 - local_130.begin.y);
                      lVar7 = (int)(uVar4 - local_130.begin.z) * local_130.kstride;
                      lVar9 = (int)((uVar27 - local_130.begin.y) + 1) * local_130.jstride;
                      dVar28 = (dVar28 * local_130.p[lVar9 + (long)(iVar11 + 1) + lVar7 + lVar5] *
                                dVar29 + dVar30 * local_130.p[lVar9 + (long)iVar11 + lVar7 + lVar5]
                                         * dVar29 +
                                         local_130.p[lVar10 + (long)iVar11 + lVar7 + lVar5] * dVar30
                                         * (double)(iVar2 - iVar26) +
                                         local_130.p[lVar10 + (long)(iVar11 + 1) + lVar7 + lVar5] *
                                         dVar28 * (double)(iVar2 - iVar26)) * local_180 * local_188;
                    }
                  }
                  else {
                    iVar26 = uVar21 - local_130.begin.x;
                    lVar9 = (int)(uVar27 - local_130.begin.y) * local_130.jstride;
                    lVar10 = local_130.kstride * (int)(uVar4 - local_130.begin.z);
                    dVar29 = (double)(int)((uVar21 + 1) * iVar1 + iVar14);
                    lVar7 = (int)((uVar4 - local_130.begin.z) + 1) * local_130.kstride;
                    dVar28 = (dVar28 * local_130.p[lVar9 + (long)(iVar26 + 1) + lVar7 + lVar5] *
                              dVar30 + dVar29 * local_130.p[lVar9 + (long)iVar26 + lVar7 + lVar5] *
                                       dVar30 + local_130.p[lVar9 + (long)iVar26 + lVar10 + lVar5] *
                                                dVar29 * (double)(iVar3 - iVar11) +
                                                local_130.p
                                                [lVar9 + (long)(iVar26 + 1) + lVar10 + lVar5] *
                                                dVar28 * (double)(iVar3 - iVar11)) *
                             local_180 * local_190;
                  }
                }
                else {
                  lVar13 = (long)(int)(uVar21 - local_130.begin.x);
                  lVar16 = local_130.jstride * (int)(uVar27 - local_130.begin.y);
                  lVar10 = local_130.kstride * (int)(uVar4 - local_130.begin.z);
                  lVar9 = (int)((uVar27 - local_130.begin.y) + 1) * local_130.jstride;
                  lVar7 = (int)((uVar4 - local_130.begin.z) + 1) * local_130.kstride;
                  dVar28 = (dVar29 * local_130.p[lVar9 + lVar13 + lVar7 + lVar5] * dVar30 +
                           (double)(iVar2 - iVar26) * local_130.p[lVar16 + lVar13 + lVar7 + lVar5] *
                           dVar30 + local_130.p[lVar16 + lVar13 + lVar10 + lVar5] *
                                    (double)(iVar2 - iVar26) * (double)(iVar3 - iVar11) +
                                    local_130.p[lVar9 + lVar13 + lVar10 + lVar5] * dVar29 *
                                    (double)(iVar3 - iVar11)) * local_188 * local_190;
                }
              }
              else {
                lVar16 = (long)(int)(uVar21 - local_130.begin.x);
                lVar9 = local_130.jstride * (int)(uVar27 - local_130.begin.y);
                lVar13 = local_130.kstride * (int)(uVar4 - local_130.begin.z);
                dVar31 = (double)(int)((uVar21 + 1) * iVar1 + iVar14);
                dVar32 = (double)(iVar2 - iVar26);
                dVar33 = (double)(iVar3 - iVar11);
                lVar22 = (long)(int)((uVar21 - local_130.begin.x) + 1);
                lVar10 = (int)((uVar27 - local_130.begin.y) + 1) * local_130.jstride;
                lVar7 = (int)((uVar4 - local_130.begin.z) + 1) * local_130.kstride;
                dVar28 = (dVar28 * local_130.p[lVar10 + lVar22 + lVar7 + lVar5] * dVar29 * dVar30 +
                         dVar31 * local_130.p[lVar10 + lVar16 + lVar7 + lVar5] * dVar29 * dVar30 +
                         local_130.p[lVar9 + lVar22 + lVar7 + lVar5] * dVar28 * dVar32 * dVar30 +
                         local_130.p[lVar9 + lVar16 + lVar7 + lVar5] * dVar31 * dVar32 * dVar30 +
                         local_130.p[lVar10 + lVar22 + lVar13 + lVar5] * dVar28 * dVar29 * dVar33 +
                         local_130.p[lVar10 + lVar16 + lVar13 + lVar5] * dVar31 * dVar29 * dVar33 +
                         local_130.p[lVar9 + lVar16 + lVar13 + lVar5] * dVar31 * dVar32 * dVar33 +
                         local_130.p[lVar9 + lVar22 + lVar13 + lVar5] * dVar28 * dVar32 * dVar33) *
                         local_180 * local_188 * local_190;
              }
              *pdVar6 = dVar28;
              uVar20 = uVar20 + 1;
              pdVar6 = pdVar6 + 1;
              iVar14 = iVar14 + -1;
            } while (local_208.bigend.vect[0] + 1U != (int)uVar20);
          }
          local_240 = local_240 + local_f0.jstride;
        }
        local_248 = local_248 + local_f0.kstride;
      }
      local_250 = local_250 + local_f0.nstride;
      local_168 = uVar8;
      uVar18 = uVar8 + 1;
    }
    MFIter::operator++(&local_90);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MFNodeBilinear::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                        IntVect const& ng, Geometry const&, Geometry const&,
                        Box const& dest_domain, IntVect const& ratio,
                        Vector<BCRec> const&, int)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                mf_nodebilin_interp(i,j,k,n, fine[box_no], fcomp, crse[box_no], ccomp, ratio);
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            auto const& fine = finemf.array(mfi);
            auto const& crse = crsemf.const_array(mfi);
            Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;
            amrex::LoopConcurrentOnCpu(fbox, nc,
            [=] (int i, int j, int k, int n) noexcept
            {
                mf_nodebilin_interp(i,j,k,n, fine, fcomp, crse, ccomp, ratio);
            });
        }
    }
}